

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_weight_html_actions::module_start(module_weight_html_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_weight_html_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"    <h3 id=\'");
  poVar1 = std::operator<<(poVar1,(string *)module);
  poVar1 = std::operator<<(poVar1,"\'><a href=\"");
  poVar1 = std::operator<<(poVar1,(string *)module);
  poVar1 = std::operator<<(poVar1,".html\">");
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,"</a></h3>");
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "    <h3 id='" << module << "'><a href=\"" << module << ".html\">" << module << "</a></h3>";
    }